

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<tcu::Vector<float,_2>_> __thiscall
vkt::shaderexecutor::Functions::Refract<2>::doExpand
          (Refract<2> *this,ExpandContext *ctx,ArgExprs *args)

{
  ExprP<tcu::Vector<float,_2>_> *arg0;
  ExprP<tcu::Vector<float,_2>_> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  double __x;
  ExprP<tcu::Vector<float,_2>_> EVar1;
  ExprP<float> k;
  ExprP<float> dotNI;
  SharedPtr<const_vkt::shaderexecutor::Variable<float>_> local_100;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_f0;
  SharedPtr<const_vkt::shaderexecutor::Variable<float>_> local_e0;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_d0;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_c0;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_b0;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_a0;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_90;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_80;
  float local_70;
  float local_6c;
  string local_68;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_48;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"dotNI",(allocator<char> *)&local_f0);
  dot<2>((Functions *)&local_100,in_RCX + 1,in_RCX);
  bindExpression<float>
            ((shaderexecutor *)&local_e0,&local_68,(ExpandContext *)args,(ExprP<float> *)&local_100)
  ;
  VariableP::operator_cast_to_ExprP((VariableP *)&local_38);
  de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::release(&local_e0);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release
            ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&local_100);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"k",(allocator<char> *)&local_70);
  local_48.m_ptr._0_4_ = 0x3f800000;
  constant<float>((shaderexecutor *)&local_80,(float *)&local_48);
  arg0 = in_RCX + 2;
  shaderexecutor::operator*((shaderexecutor *)&local_a0,(ExprP<float> *)arg0,(ExprP<float> *)arg0);
  local_6c = 1.0;
  constant<float>((shaderexecutor *)&local_c0,&local_6c);
  shaderexecutor::operator*
            ((shaderexecutor *)&local_d0,(ExprP<float> *)&local_38,(ExprP<float> *)&local_38);
  shaderexecutor::operator-
            ((shaderexecutor *)&local_b0,(ExprP<float> *)&local_c0,(ExprP<float> *)&local_d0);
  shaderexecutor::operator*
            ((shaderexecutor *)&local_90,(ExprP<float> *)&local_a0,(ExprP<float> *)&local_b0);
  shaderexecutor::operator-
            ((shaderexecutor *)&local_f0,(ExprP<float> *)&local_80,(ExprP<float> *)&local_90);
  bindExpression<float>
            ((shaderexecutor *)&local_100,&local_68,(ExpandContext *)args,(ExprP<float> *)&local_f0)
  ;
  VariableP::operator_cast_to_ExprP((VariableP *)&local_e0);
  de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::release(&local_100);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_f0);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_90);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_b0);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_d0);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_c0);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_a0);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_80);
  std::__cxx11::string::~string((string *)&local_68);
  local_6c = 0.0;
  constant<float>((shaderexecutor *)&local_100,&local_6c);
  operator<((shaderexecutor *)&local_68,(ExprP<float> *)&local_e0,(ExprP<float> *)&local_100);
  local_70 = 0.0;
  constant<float>((shaderexecutor *)&local_80,&local_70);
  GenXType<float,_2>::genXType((GenXType<float,_2> *)&local_f0,(ExprP<float> *)&local_80);
  shaderexecutor::operator*((shaderexecutor *)&local_a0,in_RCX,(ExprP<float> *)arg0);
  shaderexecutor::operator*
            ((shaderexecutor *)&local_d0,(ExprP<float> *)arg0,(ExprP<float> *)&local_38);
  sqrt((Functions *)&local_48,__x);
  shaderexecutor::operator+
            ((shaderexecutor *)&local_c0,(ExprP<float> *)&local_d0,(ExprP<float> *)&local_48);
  shaderexecutor::operator*((shaderexecutor *)&local_b0,in_RCX + 1,(ExprP<float> *)&local_c0);
  shaderexecutor::operator-
            ((shaderexecutor *)&local_90,(ExprP<tcu::Vector<float,_2>_> *)&local_a0,
             (ExprP<tcu::Vector<float,_2>_> *)&local_b0);
  cond<tcu::Vector<float,2>>
            ((shaderexecutor *)this,(ExprP<bool> *)&local_68,
             (ExprP<tcu::Vector<float,_2>_> *)&local_f0,(ExprP<tcu::Vector<float,_2>_> *)&local_90);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>::release
            ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_> *)&local_90);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>::release
            ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_> *)&local_b0);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_c0);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_48);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_d0);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>::release
            ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_> *)&local_a0);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>::release
            ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_> *)&local_f0);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_80);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<bool>_>::release
            ((SharedPtr<const_vkt::shaderexecutor::Expr<bool>_> *)&local_68);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release
            ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&local_100);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release
            ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&local_e0);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_38);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_state = extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_2>_> *)this;
  return (ExprP<tcu::Vector<float,_2>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext&	ctx, const ArgExprs& args) const
	{
		const ExprP<Arg0>&	i		= args.a;
		const ExprP<Arg1>&	n		= args.b;
		const ExprP<float>&	eta		= args.c;
		const ExprP<float>	dotNI	= bindExpression("dotNI", ctx, dot(n, i));
		const ExprP<float>	k		= bindExpression("k", ctx, constant(1.0f) - eta * eta *
												 (constant(1.0f) - dotNI * dotNI));

		return cond(k < constant(0.0f),
					genXType<float, Size>(constant(0.0f)),
					i * eta - n * (eta * dotNI + sqrt(k)));
	}